

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O0

void Abc_NodeEdgeDsdPushOrdered(Dec_Graph_t *pGraph,Vec_Int_t *vEdges,int Edge)

{
  uint uVar1;
  Dec_Edge_t DVar2;
  Dec_Edge_t DVar3;
  Dec_Node_t *pDVar4;
  int NodeNew;
  int NodeOld;
  int i;
  int Edge_local;
  Vec_Int_t *vEdges_local;
  Dec_Graph_t *pGraph_local;
  
  vEdges->nSize = vEdges->nSize + 1;
  for (NodeNew = vEdges->nSize + -2; -1 < NodeNew; NodeNew = NodeNew + -1) {
    DVar2 = Dec_IntToEdge(vEdges->pArray[NodeNew]);
    DVar3 = Dec_IntToEdge(Edge);
    pDVar4 = Dec_GraphNode(pGraph,(uint)DVar2 >> 1 & 0x3fffffff);
    uVar1 = *(uint *)&pDVar4->field_0x10;
    pDVar4 = Dec_GraphNode(pGraph,(uint)DVar3 >> 1 & 0x3fffffff);
    if ((*(uint *)&pDVar4->field_0x10 & 0x3fff) < (uVar1 & 0x3fff)) break;
    vEdges->pArray[NodeNew + 1] = vEdges->pArray[NodeNew];
  }
  vEdges->pArray[NodeNew + 1] = Edge;
  return;
}

Assistant:

void Abc_NodeEdgeDsdPushOrdered( Dec_Graph_t * pGraph, Vec_Int_t * vEdges, int Edge )
{
    int i, NodeOld, NodeNew;
    vEdges->nSize++;
    for ( i = vEdges->nSize-2; i >= 0; i-- )
    {
        NodeOld = Dec_IntToEdge(vEdges->pArray[i]).Node;
        NodeNew = Dec_IntToEdge(Edge).Node;
        // use <= because we are trying to push the new (non-existent) nodes as far as possible
        if ( Dec_GraphNode(pGraph, NodeOld)->Level <= Dec_GraphNode(pGraph, NodeNew)->Level )
            vEdges->pArray[i+1] = vEdges->pArray[i];
        else
            break;
    }
    vEdges->pArray[i+1] = Edge;
}